

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Networking.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Networking_Inline(X3DImporter *this)

{
  IOSystem *pIVar1;
  CX3DImporter_NodeElement *pParentElement;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  pointer pFVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar7;
  undefined4 extraout_var_02;
  reference __rhs;
  allocator<char> local_131;
  string local_130;
  string local_110 [32];
  long local_f0;
  size_type slashPos;
  size_type pos2;
  size_type pos;
  string full_path;
  CX3DImporter_NodeElement *ne;
  undefined1 local_a8 [8];
  string an;
  uint local_74;
  int idx_end;
  int idx;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  url;
  undefined1 local_50 [7];
  bool load;
  string use;
  string def;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(use.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_50);
  url.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size._7_1_ = 1;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&idx_end);
  local_74 = 0;
  pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar3 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_74 < iVar3; local_74 = local_74 + 1) {
    pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar4 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar6,(ulong)local_74);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,(char *)CONCAT44(extraout_var,iVar4),
               (allocator<char> *)((long)&ne + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&ne + 7));
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a8,"DEF");
    if (bVar2) {
      pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar4 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar6,(ulong)local_74);
      std::__cxx11::string::operator=
                ((string *)(use.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar4));
      ne._0_4_ = 4;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a8,"USE");
      if (bVar2) {
        pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar4 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar6,(ulong)local_74);
        std::__cxx11::string::operator=((string *)local_50,(char *)CONCAT44(extraout_var_01,iVar4));
        ne._0_4_ = 4;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a8,"bboxCenter");
        if (bVar2) {
          ne._0_4_ = 4;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a8,"bboxSize");
          if (bVar2) {
            ne._0_4_ = 4;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a8,"containerField");
            if (bVar2) {
              ne._0_4_ = 4;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_a8,"load");
              if (bVar2) {
                url.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size._7_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_74);
                ne._0_4_ = 4;
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_a8,"url");
                if (bVar2) {
                  XML_ReadNode_GetAttrVal_AsListS
                            (this,local_74,
                             (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&idx_end);
                  ne._0_4_ = 4;
                }
                else {
                  Throw_IncorrectAttr(this,(string *)local_a8);
                  ne._0_4_ = 0;
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_a8);
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar2 = FindNodeElement(this,(string *)local_50,ENET_Group,
                            (CX3DImporter_NodeElement **)((long)&full_path.field_2 + 8));
    if (!bVar2) {
      Throw_USE_NotFound(this,(string *)local_50);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)((long)&full_path.field_2 + 8));
  }
  else {
    ParseHelper_Group_Begin(this,true);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&this->NodeElement_Cur->ID,(string *)(use.field_2._M_local_buf + 8));
    }
    if (((url.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size._7_1_ & 1) != 0) &&
       (bVar2 = std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&idx_end), !bVar2)) {
      iVar3 = (*this->mpIOHandler->_vptr_IOSystem[8])();
      __rhs = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&idx_end);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_02,iVar3),__rhs);
      pos2 = std::__cxx11::string::find((string *)&pos,0x1022570);
      while (pos2 != 0xffffffffffffffff) {
        if (pos2 == 0) {
          pos2 = 3;
        }
        else {
          slashPos = std::__cxx11::string::rfind((char)&pos,0x2f);
          if (slashPos == 0xffffffffffffffff) {
            std::__cxx11::string::erase((ulong)&pos,0);
            pos2 = 0;
          }
          else {
            std::__cxx11::string::erase((ulong)&pos,slashPos);
            pos2 = slashPos;
          }
        }
        pos2 = std::__cxx11::string::find((string *)&pos,0x1022570);
      }
      local_f0 = std::__cxx11::string::find_last_of((char *)&pos,0xbad9f5);
      pIVar1 = this->mpIOHandler;
      if (local_f0 == -1) {
        std::__cxx11::string::string(local_110);
      }
      else {
        std::__cxx11::string::substr((ulong)local_110,(ulong)&pos);
      }
      (*pIVar1->_vptr_IOSystem[7])(pIVar1,local_110);
      std::__cxx11::string::~string(local_110);
      ParseFile(this,(string *)&pos,this->mpIOHandler);
      (*this->mpIOHandler->_vptr_IOSystem[10])();
      std::__cxx11::string::~string((string *)&pos);
    }
    pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar5 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((uVar5 & 1) == 0) {
      pParentElement = this->NodeElement_Cur;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Inline",&local_131);
      ParseNode_Metadata(this,pParentElement,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
    }
    ParseHelper_Node_Exit(this);
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&idx_end);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(use.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Networking_Inline()
{
    std::string def, use;
    bool load = true;
    std::list<std::string> url;

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("load", load, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("url", url, XML_ReadNode_GetAttrVal_AsListS);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		CX3DImporter_NodeElement* ne;

		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Group, ne);
	}
	else
	{
		ParseHelper_Group_Begin(true);// create new grouping element and go deeper if node has children.
		// at this place new group mode created and made current, so we can name it.
		if(!def.empty()) NodeElement_Cur->ID = def;

		if(load && !url.empty())
		{
			std::string full_path = mpIOHandler->CurrentDirectory() + url.front();

			//full_path = std::regex_replace(full_path, pattern_parentDir, "$1");
			for (std::string::size_type pos = full_path.find(parentDir); pos != std::string::npos; pos = full_path.find(parentDir, pos)) {
				if (pos > 0) {
					std::string::size_type pos2 = full_path.rfind('/', pos - 1);
					if (pos2 != std::string::npos) {
						full_path.erase(pos2, pos - pos2 + 3);
						pos = pos2;
					}
					else {
						full_path.erase(0, pos + 4);
						pos = 0;
					}
				}
				else {
					pos += 3;
				}
			}
			// Attribute "url" can contain list of strings. But we need only one - first.
			std::string::size_type slashPos = full_path.find_last_of("\\/");
			mpIOHandler->PushDirectory(slashPos == std::string::npos ? std::string() : full_path.substr(0, slashPos + 1));
			ParseFile(full_path, mpIOHandler);
			mpIOHandler->PopDirectory();
		}

		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement()) ParseNode_Metadata(NodeElement_Cur, "Inline");

		// exit from node in that place
		ParseHelper_Node_Exit();
	}// if(!use.empty()) else
}